

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.cpp
# Opt level: O2

bool ast::case_insensitive_compare(Symbol *a,Symbol *b)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = (a->name)._M_string_length;
  uVar4 = 0;
  do {
    uVar5 = (ulong)uVar4;
    if (uVar1 <= uVar5) {
      return uVar1 < (b->name)._M_string_length;
    }
    iVar2 = tolower((int)(a->name)._M_dataplus._M_p[uVar5]);
    iVar3 = tolower((int)(b->name)._M_dataplus._M_p[uVar5]);
    uVar4 = uVar4 + 1;
  } while (iVar2 == iVar3);
  return iVar2 < iVar3;
}

Assistant:

static bool case_insensitive_compare(Symbol *a, Symbol *b)
{
	auto size = a->name.size();
	for (auto i = 0U; i < size; ++i) {
		auto char_a = tolower(a->name[i]);
		auto char_b = tolower(b->name[i]);
		if (char_a != char_b)
			return char_a < char_b;
	}
	return a->name.size() < b->name.size();
}